

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::TextureMipmapTests::init(TextureMipmapTests *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  TestContext *pTVar2;
  Context *pCVar3;
  RenderContext *pRVar4;
  ContextInfo *renderCtxInfo;
  TextureMipmapTests *pTVar5;
  Texture2DGenMipmapCase *node;
  uint uVar6;
  uint uVar7;
  TestNode *pTVar8;
  size_t sVar9;
  Texture2DMipmapCase *pTVar10;
  long lVar11;
  TextureCubeMipmapCase *this_00;
  TestNode *node_00;
  TextureCubeGenMipmapCase *this_01;
  anon_struct_16_3_5cb0d78b *paVar12;
  undefined8 unaff_RBP;
  long lVar13;
  bool bVar14;
  anon_struct_16_3_5cb0d78b *local_218;
  TextureMipmapTests *local_210;
  Texture2DGenMipmapCase *local_208;
  uint local_1fc;
  anon_struct_16_2_3f8b7511 *local_1f8;
  TestNode *local_1f0;
  long *local_1e8;
  long local_1d8 [2];
  long local_1c8;
  TestNode *local_1c0;
  long local_1b8;
  long local_1b0;
  ostringstream name;
  ios_base local_138 [264];
  
  local_1f0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_1f0,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Mipmapping");
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cube Map Filtering");
  tcu::TestNode::addChild((TestNode *)this,local_1f0);
  local_1c0 = pTVar8;
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar13 = 0;
  local_210 = this;
  do {
    pTVar5 = local_210;
    pTVar8 = (TestNode *)operator_new(0x70);
    local_1b8 = lVar13;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,
               (pTVar5->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::coordTypes[lVar13].name,init::coordTypes[lVar13].desc);
    tcu::TestNode::addChild(local_1f0,pTVar8);
    local_208 = (Texture2DGenMipmapCase *)(ulong)init::coordTypes[lVar13].type;
    lVar13 = 0;
    do {
      local_1f8 = init::minFilterModes + lVar13;
      lVar11 = 0;
      local_1b0 = lVar13;
      do {
        local_218 = (anon_struct_16_3_5cb0d78b *)(init::wrapModes + lVar11);
        unaff_RBP = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
        lVar13 = 0;
        local_1c8 = lVar11;
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
          pcVar1 = local_1f8->name;
          if (pcVar1 == (char *)0x0) {
            std::ios::clear((int)&local_218 + (int)*(undefined8 *)(_name + -0x18) + 0x70);
          }
          else {
            sVar9 = strlen(pcVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar1,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
          pcVar1 = local_218->name;
          if (pcVar1 == (char *)0x0) {
            std::ios::clear((int)&local_218 + (int)*(undefined8 *)(_name + -0x18) + 0x70);
          }
          else {
            sVar9 = strlen(pcVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar1,sVar9);
          }
          pcVar1 = init::tex2DSizes[lVar13].name;
          if (pcVar1 != (char *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
            sVar9 = strlen(pcVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar1,sVar9);
          }
          pTVar10 = (Texture2DMipmapCase *)operator_new(0x100);
          local_1fc = (uint)unaff_RBP;
          pTVar2 = (local_210->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
          pCVar3 = (local_210->super_TestCaseGroup).m_context;
          pRVar4 = pCVar3->m_renderCtx;
          renderCtxInfo = pCVar3->m_contextInfo;
          std::__cxx11::stringbuf::str();
          Texture2DMipmapCase::Texture2DMipmapCase
                    (pTVar10,pTVar2,pRVar4,renderCtxInfo,(char *)local_1e8,"",(CoordType)local_208,
                     local_1f8->mode,local_218->format,local_218->format,0x1908,0x1401,
                     init::tex2DSizes[lVar13].width,0x40);
          tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar10);
          if (local_1e8 != local_1d8) {
            operator_delete(local_1e8,local_1d8[0] + 1);
          }
          bVar14 = (int)local_208 == 0;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
          std::ios_base::~ios_base(local_138);
          pTVar5 = local_210;
          lVar13 = 1;
          unaff_RBP = 0;
        } while (((byte)local_1fc & bVar14) != 0);
        lVar11 = local_1c8 + 1;
      } while (lVar11 != 3);
      lVar13 = local_1b0 + 1;
    } while (lVar13 != 4);
    lVar13 = local_1b8 + 1;
  } while (lVar13 != 3);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (pTVar5->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"bias",
             "User-supplied bias value");
  tcu::TestNode::addChild(local_1f0,pTVar8);
  lVar13 = 0;
  do {
    pTVar10 = (Texture2DMipmapCase *)operator_new(0x100);
    pCVar3 = (local_210->super_TestCaseGroup).m_context;
    Texture2DMipmapCase::Texture2DMipmapCase
              (pTVar10,(local_210->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx
               ,pCVar3->m_renderCtx,pCVar3->m_contextInfo,
               *(char **)((long)&init::minFilterModes[0].name + lVar13),"",COORDTYPE_BASIC_BIAS,
               *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar13),0x2901,0x2901,0x1908,
               0x1401,0x40,0x40);
    tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar10);
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x40);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (local_210->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "generate","Mipmap generation tests");
  tcu::TestNode::addChild(local_1f0,pTVar8);
  lVar13 = 0;
  do {
    local_218 = init::formats + lVar13;
    lVar11 = 0;
    uVar6 = 0x775101;
    local_1c8 = lVar13;
    do {
      uVar7 = 0x775101;
      lVar13 = 0;
      local_1fc = uVar6;
      do {
        local_1f8 = (anon_struct_16_2_3f8b7511 *)CONCAT44(local_1f8._4_4_,uVar7);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        pcVar1 = local_218->name;
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)&local_218 + (int)*(undefined8 *)(_name + -0x18) + 0x70);
        }
        else {
          sVar9 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar1,sVar9);
        }
        pcVar1 = init::tex2DSizes[lVar11].name;
        if (pcVar1 != (char *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
          sVar9 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar1,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
        pcVar1 = init::genHints[lVar13].name;
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)&local_218 + (int)*(undefined8 *)(_name + -0x18) + 0x70);
        }
        else {
          sVar9 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar1,sVar9);
        }
        local_208 = (Texture2DGenMipmapCase *)operator_new(0xf0);
        pTVar2 = (local_210->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pRVar4 = ((local_210->super_TestCaseGroup).m_context)->m_renderCtx;
        std::__cxx11::stringbuf::str();
        node = local_208;
        Texture2DGenMipmapCase::Texture2DGenMipmapCase
                  (local_208,pTVar2,pRVar4,(char *)local_1e8,"",local_218->format,
                   local_218->dataType,init::genHints[lVar13].hint,init::tex2DSizes[lVar11].width,
                   0x40);
        tcu::TestNode::addChild(pTVar8,(TestNode *)node);
        if (local_1e8 != local_1d8) {
          operator_delete(local_1e8,local_1d8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        std::ios_base::~ios_base(local_138);
        lVar13 = 1;
        uVar7 = 0;
      } while (((ulong)local_1f8 & 1) != 0);
      lVar11 = 1;
      uVar6 = uVar7;
    } while ((local_1fc & 1) != 0);
    lVar13 = local_1c8 + 1;
  } while (lVar13 != 8);
  paVar12 = (anon_struct_16_3_5cb0d78b *)0x0;
  do {
    pTVar8 = (TestNode *)operator_new(0x70);
    local_218 = paVar12;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,
               (local_210->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::cubeCoordTypes[(long)paVar12].name,init::cubeCoordTypes[(long)paVar12].desc);
    tcu::TestNode::addChild(local_1c0,pTVar8);
    lVar13 = 0;
    do {
      this_00 = (TextureCubeMipmapCase *)operator_new(0x100);
      pCVar3 = (local_210->super_TestCaseGroup).m_context;
      TextureCubeMipmapCase::TextureCubeMipmapCase
                (this_00,(local_210->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                         m_testCtx,pCVar3->m_renderCtx,pCVar3->m_contextInfo,
                 *(char **)((long)&init::minFilterModes[0].name + lVar13),"",
                 init::cubeCoordTypes[(long)paVar12].type,
                 *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar13),0x812f,0x812f,0x1908,
                 0x1401,0x40);
      tcu::TestNode::addChild(pTVar8,(TestNode *)this_00);
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x40);
    paVar12 = (anon_struct_16_3_5cb0d78b *)((long)&local_218->name + 1);
  } while (paVar12 != (anon_struct_16_3_5cb0d78b *)0x3);
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (local_210->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "generate","Mipmap generation tests");
  tcu::TestNode::addChild(local_1c0,node_00);
  local_208 = (Texture2DGenMipmapCase *)0x0;
  do {
    local_218 = init::formats + (long)local_208;
    pTVar8 = (TestNode *)CONCAT71((int7)((ulong)pTVar8 >> 8),1);
    lVar13 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
      pcVar1 = local_218->name;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)&local_218 + (int)*(undefined8 *)(_name + -0x18) + 0x70);
      }
      else {
        sVar9 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar1,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
      pcVar1 = init::genHints[lVar13].name;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)&local_218 + (int)*(undefined8 *)(_name + -0x18) + 0x70);
      }
      else {
        sVar9 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar1,sVar9);
      }
      this_01 = (TextureCubeGenMipmapCase *)operator_new(0xe8);
      local_1f8 = (anon_struct_16_2_3f8b7511 *)CONCAT44(local_1f8._4_4_,(int)pTVar8);
      pTVar2 = (local_210->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar4 = ((local_210->super_TestCaseGroup).m_context)->m_renderCtx;
      std::__cxx11::stringbuf::str();
      TextureCubeGenMipmapCase::TextureCubeGenMipmapCase
                (this_01,pTVar2,pRVar4,(char *)local_1e8,"",local_218->format,local_218->dataType,
                 init::genHints[lVar13].hint,0x40);
      tcu::TestNode::addChild(node_00,(TestNode *)this_01);
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8,local_1d8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
      std::ios_base::~ios_base(local_138);
      lVar13 = 1;
      pTVar8 = (TestNode *)0x0;
    } while (((ulong)local_1f8 & 1) != 0);
    local_208 = (Texture2DGenMipmapCase *)((long)local_208 + 1);
  } while (local_208 != (Texture2DGenMipmapCase *)0x8);
  return 8;
}

Assistant:

void TextureMipmapTests::init (void)
{
	tcu::TestCaseGroup* group2D		= new tcu::TestCaseGroup(m_testCtx, "2d",	"2D Texture Mipmapping");
	tcu::TestCaseGroup*	groupCube	= new tcu::TestCaseGroup(m_testCtx, "cube",	"Cube Map Filtering");
	addChild(group2D);
	addChild(groupCube);

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_nearest",		GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_linear",		GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_linear",		GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} coordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_AFFINE,		"affine",		"Mipmapping with affine coordinate transform"		},
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			}
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
		deUint32		dataType;
	} formats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "la88",		GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba5551",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	static const struct
	{
		const char*		name;
		deUint32		hint;
	} genHints[] =
	{
		{ "fastest",	GL_FASTEST },
		{ "nicest",		GL_NICEST }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} tex2DSizes[] =
	{
		{ DE_NULL,		64, 64 }, // Default.
		{ "non_square",	32, 64 }
	};

	// 2D cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, coordTypes[coordType].name, coordTypes[coordType].desc);
		group2D->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
			{
				// Add non_square variants to basic cases only.
				int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex2DSizes) : 1;

				for (int size = 0; size < sizeEnd; size++)
				{
					std::ostringstream name;
					name << minFilterModes[minFilter].name
						 << "_" << wrapModes[wrapMode].name;

					if (tex2DSizes[size].name)
						name << "_" << tex2DSizes[size].name;

					coordTypeGroup->addChild(new Texture2DMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
																	 name.str().c_str(), "",
																	 coordTypes[coordType].type,
																	 minFilterModes[minFilter].mode,
																	 wrapModes[wrapMode].mode,
																	 wrapModes[wrapMode].mode,
																	 GL_RGBA, GL_UNSIGNED_BYTE,
																	 tex2DSizes[size].width, tex2DSizes[size].height));
				}
			}
		}
	}

	// 2D bias variants.
	{
		tcu::TestCaseGroup* biasGroup = new tcu::TestCaseGroup(m_testCtx, "bias", "User-supplied bias value");
		group2D->addChild(biasGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			biasGroup->addChild(new Texture2DMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
														minFilterModes[minFilter].name, "",
														COORDTYPE_BASIC_BIAS,
														minFilterModes[minFilter].mode,
														GL_REPEAT, GL_REPEAT,
														GL_RGBA, GL_UNSIGNED_BYTE,
														tex2DSizes[0].width, tex2DSizes[0].height));
	}

	// 2D mipmap generation variants.
	{
		tcu::TestCaseGroup* genMipmapGroup = new tcu::TestCaseGroup(m_testCtx, "generate", "Mipmap generation tests");
		group2D->addChild(genMipmapGroup);

		for (int format = 0; format < DE_LENGTH_OF_ARRAY(formats); format++)
		{
			for (int size = 0; size < DE_LENGTH_OF_ARRAY(tex2DSizes); size++)
			{
				for (int hint = 0; hint < DE_LENGTH_OF_ARRAY(genHints); hint++)
				{
					std::ostringstream name;
					name << formats[format].name;

					if (tex2DSizes[size].name)
						name << "_" << tex2DSizes[size].name;

					name << "_" << genHints[hint].name;

					genMipmapGroup->addChild(new Texture2DGenMipmapCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "",
																		formats[format].format, formats[format].dataType, genHints[hint].hint,
																		tex2DSizes[size].width, tex2DSizes[size].height));
				}
			}
		}
	}

	const int cubeMapSize = 64;

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} cubeCoordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			},
		{ COORDTYPE_BASIC_BIAS,	"bias",			"User-supplied bias value"							}
	};

	// Cubemap cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(cubeCoordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, cubeCoordTypes[coordType].name, cubeCoordTypes[coordType].desc);
		groupCube->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			coordTypeGroup->addChild(new TextureCubeMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
															   minFilterModes[minFilter].name, "",
															   cubeCoordTypes[coordType].type,
															   minFilterModes[minFilter].mode,
															   GL_CLAMP_TO_EDGE,
															   GL_CLAMP_TO_EDGE,
															   GL_RGBA, GL_UNSIGNED_BYTE, cubeMapSize));
		}
	}

	// Cubemap mipmap generation variants.
	{
		tcu::TestCaseGroup* genMipmapGroup = new tcu::TestCaseGroup(m_testCtx, "generate", "Mipmap generation tests");
		groupCube->addChild(genMipmapGroup);

		for (int format = 0; format < DE_LENGTH_OF_ARRAY(formats); format++)
		{
			for (int hint = 0; hint < DE_LENGTH_OF_ARRAY(genHints); hint++)
			{
				std::ostringstream name;
				name << formats[format].name
					 << "_" << genHints[hint].name;

				genMipmapGroup->addChild(new TextureCubeGenMipmapCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "", formats[format].format, formats[format].dataType, genHints[hint].hint, cubeMapSize));
			}
		}
	}
}